

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void EditTableColumnsFlags(ImGuiTableColumnFlags *p_flags)

{
  bool bVar1;
  uint *in_RDI;
  
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::SameLine(p_flags._4_4_,p_flags._0_4_);
  HelpMarker((char *)0x17f756);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  bVar1 = ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  if (bVar1) {
    *in_RDI = *in_RDI & 0xffffffef;
  }
  bVar1 = ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  if (bVar1) {
    *in_RDI = *in_RDI & 0xfffffff7;
  }
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::SameLine(p_flags._4_4_,p_flags._0_4_);
  HelpMarker((char *)0x17f8e4);
  ImGui::CheckboxFlags((char *)p_flags,(int *)in_RDI,0);
  ImGui::SameLine(p_flags._4_4_,p_flags._0_4_);
  HelpMarker((char *)0x17f915);
  return;
}

Assistant:

static void EditTableColumnsFlags(ImGuiTableColumnFlags* p_flags)
{
    ImGui::CheckboxFlags("_Disabled", p_flags, ImGuiTableColumnFlags_Disabled); ImGui::SameLine(); HelpMarker("Master disable flag (also hide from context menu)");
    ImGui::CheckboxFlags("_DefaultHide", p_flags, ImGuiTableColumnFlags_DefaultHide);
    ImGui::CheckboxFlags("_DefaultSort", p_flags, ImGuiTableColumnFlags_DefaultSort);
    if (ImGui::CheckboxFlags("_WidthStretch", p_flags, ImGuiTableColumnFlags_WidthStretch))
        *p_flags &= ~(ImGuiTableColumnFlags_WidthMask_ ^ ImGuiTableColumnFlags_WidthStretch);
    if (ImGui::CheckboxFlags("_WidthFixed", p_flags, ImGuiTableColumnFlags_WidthFixed))
        *p_flags &= ~(ImGuiTableColumnFlags_WidthMask_ ^ ImGuiTableColumnFlags_WidthFixed);
    ImGui::CheckboxFlags("_NoResize", p_flags, ImGuiTableColumnFlags_NoResize);
    ImGui::CheckboxFlags("_NoReorder", p_flags, ImGuiTableColumnFlags_NoReorder);
    ImGui::CheckboxFlags("_NoHide", p_flags, ImGuiTableColumnFlags_NoHide);
    ImGui::CheckboxFlags("_NoClip", p_flags, ImGuiTableColumnFlags_NoClip);
    ImGui::CheckboxFlags("_NoSort", p_flags, ImGuiTableColumnFlags_NoSort);
    ImGui::CheckboxFlags("_NoSortAscending", p_flags, ImGuiTableColumnFlags_NoSortAscending);
    ImGui::CheckboxFlags("_NoSortDescending", p_flags, ImGuiTableColumnFlags_NoSortDescending);
    ImGui::CheckboxFlags("_NoHeaderLabel", p_flags, ImGuiTableColumnFlags_NoHeaderLabel);
    ImGui::CheckboxFlags("_NoHeaderWidth", p_flags, ImGuiTableColumnFlags_NoHeaderWidth);
    ImGui::CheckboxFlags("_PreferSortAscending", p_flags, ImGuiTableColumnFlags_PreferSortAscending);
    ImGui::CheckboxFlags("_PreferSortDescending", p_flags, ImGuiTableColumnFlags_PreferSortDescending);
    ImGui::CheckboxFlags("_IndentEnable", p_flags, ImGuiTableColumnFlags_IndentEnable); ImGui::SameLine(); HelpMarker("Default for column 0");
    ImGui::CheckboxFlags("_IndentDisable", p_flags, ImGuiTableColumnFlags_IndentDisable); ImGui::SameLine(); HelpMarker("Default for column >0");
}